

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared-validator.cc
# Opt level: O0

Result __thiscall
wabt::SharedValidator::OnElemSegmentElemExpr_RefFunc
          (SharedValidator *this,Location *loc,Var *func_var)

{
  char *pcVar1;
  int __c;
  value_type_conflict5 local_7c;
  Var local_78;
  Enum local_2c;
  Var *local_28;
  Var *func_var_local;
  Location *loc_local;
  SharedValidator *this_local;
  Result result;
  
  local_28 = func_var;
  func_var_local = (Var *)loc;
  loc_local = (Location *)this;
  Result::Result((Result *)((long)&this_local + 4),Ok);
  Var::Var(&local_78,func_var);
  local_2c = (Enum)CheckFuncIndex(this,&local_78,(FuncType *)0x0);
  pcVar1 = (char *)(ulong)local_2c;
  Result::operator|=((Result *)((long)&this_local + 4),(Result)local_2c);
  Var::~Var(&local_78);
  pcVar1 = Var::index(func_var,pcVar1,__c);
  local_7c = (value_type_conflict5)pcVar1;
  std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::insert
            (&this->declared_funcs_,&local_7c);
  return (Result)this_local._4_4_;
}

Assistant:

Result SharedValidator::OnElemSegmentElemExpr_RefFunc(const Location& loc,
                                                      Var func_var) {
  Result result = Result::Ok;
  result |= CheckFuncIndex(func_var);
  declared_funcs_.insert(func_var.index());
  return result;
}